

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MhsWriter.cpp
# Opt level: O2

void __thiscall
adios2::core::engine::MhsWriter::MhsWriter(MhsWriter *this,IO *io,string *name,Mode mode,Comm *comm)

{
  _Rb_tree_header *p_Var1;
  ADIOS *this_00;
  IO *this_01;
  MhsWriter *pMVar2;
  bool bVar3;
  const_iterator cVar4;
  const_iterator cVar5;
  int __val;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_02;
  allocator local_13c;
  allocator local_13b;
  allocator local_13a;
  allocator local_139;
  MhsWriter *local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_130;
  Comm local_128;
  string local_120;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<adios2::core::Operator>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<adios2::core::Operator>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_100;
  vector<adios2::core::Engine*,std::allocator<adios2::core::Engine*>> *local_f8;
  vector<adios2::core::IO*,std::allocator<adios2::core::IO*>> *local_f0;
  Params *local_e8;
  IO *local_e0;
  int *local_d8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_138 = this;
  std::__cxx11::string::string((string *)&local_70,"MhsWriter",(allocator *)&local_120);
  helper::Comm::Comm(&local_128,comm);
  pMVar2 = local_138;
  Engine::Engine(&local_138->super_Engine,&local_70,io,name,mode,&local_128);
  helper::Comm::~Comm(&local_128);
  std::__cxx11::string::~string((string *)&local_70);
  (pMVar2->super_Engine)._vptr_Engine = (_func_int **)&PTR__MhsWriter_00825a98;
  local_f0 = (vector<adios2::core::IO*,std::allocator<adios2::core::IO*>> *)&pMVar2->m_SubIOs;
  local_f8 = (vector<adios2::core::Engine*,std::allocator<adios2::core::Engine*>> *)
             &pMVar2->m_SubEngines;
  local_100 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<adios2::core::Operator>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<adios2::core::Operator>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
               *)&pMVar2->m_TransportMap;
  (pMVar2->m_SubIOs).super__Vector_base<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pMVar2->m_SubIOs).super__Vector_base<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pMVar2->m_SubIOs).super__Vector_base<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pMVar2->m_SubEngines).
  super__Vector_base<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pMVar2->m_SubEngines).
  super__Vector_base<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pMVar2->m_SubEngines).
  super__Vector_base<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pMVar2->m_TransportMap)._M_h._M_buckets = &(pMVar2->m_TransportMap)._M_h._M_single_bucket;
  (pMVar2->m_TransportMap)._M_h._M_bucket_count = 1;
  (pMVar2->m_TransportMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (pMVar2->m_TransportMap)._M_h._M_element_count = 0;
  (pMVar2->m_TransportMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (pMVar2->m_TransportMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (pMVar2->m_TransportMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pMVar2->m_Tiers = 1;
  std::__cxx11::string::string((string *)&local_120,"Tiers",(allocator *)&local_d0);
  local_d8 = &pMVar2->m_Tiers;
  local_e8 = &io->m_Parameters;
  helper::GetParameter<int>(local_e8,&local_120,local_d8);
  std::__cxx11::string::~string((string *)&local_120);
  local_130 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (io->m_TransportsParameters).
              super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_e0 = io;
  for (this_02 = &((io->m_TransportsParameters).
                   super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_t;
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02 != local_130;
      this_02 = this_02 + 1) {
    std::__cxx11::string::string((string *)&local_120,"variable",(allocator *)&local_d0);
    cVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(this_02,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    p_Var1 = &(this_02->_M_impl).super__Rb_tree_header;
    if (p_Var1 != (_Rb_tree_header *)cVar4._M_node) {
      std::__cxx11::string::string((string *)&local_120,"transport",(allocator *)&local_d0);
      cVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(this_02,&local_120);
      std::__cxx11::string::~string((string *)&local_120);
      if (p_Var1 != (_Rb_tree_header *)cVar5._M_node) {
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(cVar5._M_node + 2),"sirius");
        if (bVar3) {
          std::
          make_shared<adios2::core::compress::CompressSirius,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&>
                    ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_120);
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<adios2::core::Operator>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<adios2::core::Operator>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_emplace<std::__cxx11::string_const&,std::shared_ptr<adios2::core::compress::CompressSirius>>
                    (local_100,cVar4._M_node + 2,&local_120);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_120._M_string_length);
        }
        else {
          std::__cxx11::string::string((string *)&local_120,"Engine",&local_139);
          std::__cxx11::string::string((string *)&local_d0,"MhsWriter",&local_13a);
          std::__cxx11::string::string((string *)&local_b0,"MhsWriter",&local_13b);
          std::__cxx11::string::string((string *)&local_90,"invalid operator",&local_13c);
          helper::Throw<std::invalid_argument>(&local_120,&local_d0,&local_b0,&local_90,-1);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_120);
        }
      }
    }
  }
  local_130 = &(local_138->super_Engine).m_Name;
  for (__val = 0; __val < *local_d8; __val = __val + 1) {
    this_00 = local_e0->m_ADIOS;
    std::__cxx11::to_string(&local_120,__val);
    std::operator+(&local_50,"SubIO",&local_120);
    local_d0._M_dataplus._M_p = (pointer)ADIOS::DeclareIO(this_00,&local_50,Auto);
    std::vector<adios2::core::IO*,std::allocator<adios2::core::IO*>>::
    emplace_back<adios2::core::IO*>(local_f0,(IO **)&local_d0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_120);
    this_01 = (local_138->m_SubIOs).
              super__Vector_base<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_>._M_impl.
              super__Vector_impl_data._M_finish[-1];
    std::operator+(&local_d0,local_130,".tier");
    std::__cxx11::to_string(&local_b0,__val);
    std::operator+(&local_120,&local_d0,&local_b0);
    local_90._M_dataplus._M_p = (pointer)IO::Open(this_01,&local_120,Write);
    std::vector<adios2::core::Engine*,std::allocator<adios2::core::Engine*>>::
    emplace_back<adios2::core::Engine*>(local_f8,(Engine **)&local_90);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  (local_138->super_Engine).m_IsOpen = true;
  return;
}

Assistant:

MhsWriter::MhsWriter(IO &io, const std::string &name, const Mode mode, helper::Comm comm)
: Engine("MhsWriter", io, name, mode, std::move(comm))
{
    helper::GetParameter(io.m_Parameters, "Tiers", m_Tiers);
    for (const auto &transportParams : io.m_TransportsParameters)
    {
        auto itVar = transportParams.find("variable");
        if (itVar == transportParams.end())
        {
            continue;
        }
        auto itTransport = transportParams.find("transport");
        if (itTransport == transportParams.end())
        {
            continue;
        }

        if (itTransport->second == "sirius")
        {
            m_TransportMap.emplace(itVar->second,
                                   std::make_shared<compress::CompressSirius>(io.m_Parameters));
        }
        else
        {
            helper::Throw<std::invalid_argument>("Engine", "MhsWriter", "MhsWriter",
                                                 "invalid operator");
        }
    }
    for (int i = 0; i < m_Tiers; ++i)
    {
        m_SubIOs.emplace_back(&io.m_ADIOS.DeclareIO("SubIO" + std::to_string(i)));
        m_SubEngines.emplace_back(
            &m_SubIOs.back()->Open(m_Name + ".tier" + std::to_string(i), adios2::Mode::Write));
    }
    m_IsOpen = true;
}